

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O1

void __thiscall wasm::SExpressionWasmBuilder::parseImport(SExpressionWasmBuilder *this,Element *s)

{
  _Rb_tree_header *p_Var1;
  pointer *ppNVar2;
  pointer puVar3;
  _Head_base<0UL,_wasm::Global_*,_false> _Var4;
  size_t sVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  SExpressionWasmBuilder *pSVar9;
  _Head_base<0UL,_wasm::Function_*,_false> _Var10;
  _Head_base<0UL,_wasm::Function_*,_false> curr;
  uint uVar11;
  bool bVar12;
  List *pLVar13;
  Element *pEVar14;
  size_t sVar15;
  mapped_type *pmVar16;
  Tag *curr_00;
  Function *pFVar17;
  undefined7 extraout_var;
  SExpressionWasmBuilder *s_00;
  Address AVar18;
  long *plVar19;
  string *psVar20;
  uint uVar21;
  char *extraout_RDX;
  char *extraout_RDX_00;
  ulong uVar22;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  undefined4 uVar23;
  iterator iVar24;
  SExpressionWasmBuilder *pSVar25;
  vector<wasm::Name,std::allocator<wasm::Name>> *this_00;
  undefined8 unaff_R12;
  undefined8 uVar26;
  uint uVar27;
  char *pcVar28;
  uint uVar29;
  bool bVar30;
  IString str;
  IString str_00;
  IString str_01;
  IString str_02;
  string_view s_01;
  string_view s_02;
  string_view s_03;
  IString IVar31;
  string_view sVar32;
  Signature SVar33;
  undefined1 *local_168;
  long local_160;
  undefined1 local_158 [16];
  undefined1 *local_148;
  long local_140;
  undefined1 local_138 [16];
  undefined1 *local_128;
  long local_120;
  undefined1 local_118 [16];
  undefined1 *local_108;
  long local_100;
  undefined1 local_f8 [16];
  undefined1 *local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  char *local_c8;
  long *local_c0 [2];
  long local_b0 [2];
  HeapType *local_a0;
  char *local_98;
  char *local_90;
  string_view local_88;
  SExpressionWasmBuilder *local_70;
  char *local_68;
  undefined4 local_5c;
  _Head_base<0UL,_wasm::Function_*,_false> local_58;
  __single_object func;
  undefined1 local_48 [24];
  
  pLVar13 = Element::list(s);
  if ((pLVar13->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).usedElements
      == 4) {
    pEVar14 = Element::operator[](s,3);
    uVar26 = CONCAT71((int7)((ulong)unaff_R12 >> 8),pEVar14->isList_);
  }
  else {
    uVar26 = 0;
  }
  local_a0 = (HeapType *)CONCAT44(local_a0._4_4_,(int)uVar26);
  local_70 = this;
  if ((byte)uVar26 == 0) {
    local_68 = (char *)CONCAT44(local_68._4_4_,0xffffffff);
    bVar12 = false;
LAB_00997af6:
    bVar7 = false;
LAB_00997af9:
    bVar8 = false;
LAB_00997afc:
    local_5c = 0;
LAB_00997b03:
    bVar30 = false;
  }
  else {
    pEVar14 = Element::operator[](s,3);
    IVar31.str._M_str = extraout_RDX;
    IVar31.str._M_len = DAT_00dbd120;
    bVar12 = elementStartsWith(pEVar14,IVar31);
    if (bVar12) {
      local_68 = (char *)((ulong)local_68 & 0xffffffff00000000);
      bVar12 = true;
      goto LAB_00997af6;
    }
    pEVar14 = Element::operator[](s,3);
    str.str._M_str = extraout_RDX_00;
    str.str._M_len = DAT_00dbd150;
    bVar12 = elementStartsWith(pEVar14,str);
    if (bVar12) {
      local_68 = (char *)CONCAT44(local_68._4_4_,2);
      bVar8 = true;
      bVar12 = false;
      bVar7 = false;
      goto LAB_00997afc;
    }
    pEVar14 = Element::operator[](s,3);
    str_00.str._M_str = extraout_RDX_01;
    str_00.str._M_len = DAT_00dbd1a0;
    bVar12 = elementStartsWith(pEVar14,str_00);
    if (bVar12) {
      local_68 = (char *)CONCAT44(local_68._4_4_,1);
      local_5c = (undefined4)CONCAT71(extraout_var,1);
      bVar12 = false;
      bVar7 = false;
      bVar8 = false;
      goto LAB_00997b03;
    }
    pEVar14 = Element::operator[](s,3);
    str_01.str._M_str = extraout_RDX_02;
    str_01.str._M_len = DAT_00dbd110;
    bVar12 = elementStartsWith(pEVar14,str_01);
    if (bVar12) {
      local_68 = (char *)CONCAT44(local_68._4_4_,3);
      bVar7 = true;
      bVar12 = false;
      goto LAB_00997af9;
    }
    pEVar14 = Element::operator[](s,3);
    bVar12 = false;
    pEVar14 = Element::operator[](pEVar14,0);
    IVar31 = Element::str(pEVar14);
    bVar30 = IVar31.str._M_str == DAT_00dbd370;
    local_68 = (char *)CONCAT44(local_68._4_4_,(uint)bVar30 * 5 + -1);
    local_a0 = (HeapType *)
               CONCAT44(local_a0._4_4_,
                        (int)CONCAT71((int7)((ulong)uVar26 >> 8),(byte)uVar26 & bVar30));
    bVar7 = false;
    bVar8 = false;
    local_5c = 0;
  }
  local_88 = (string_view)ZEXT816(0);
  pLVar13 = Element::list(s);
  if (((pLVar13->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).usedElements
       < 4) || (pEVar14 = Element::operator[](s,3), pEVar14->isList_ != false)) {
    local_90 = (char *)0x1;
    if ((char)local_a0 != '\0') {
      pEVar14 = Element::operator[](s,3);
      pLVar13 = Element::list(pEVar14);
      if (1 < (pLVar13->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).
              usedElements) {
        pEVar14 = Element::operator[](s,3);
        pEVar14 = Element::operator[](pEVar14,1);
        if (pEVar14->isList_ == false) {
          local_98 = (char *)0x1;
          if ((pEVar14->dollared_ & 1U) != 0) {
            pEVar14 = Element::operator[](s,3);
            pEVar14 = Element::operator[](pEVar14,1);
            local_88 = (string_view)Element::str(pEVar14);
            local_98 = (char *)0x1;
            local_90 = (char *)0x2;
          }
          goto LAB_00997c59;
        }
      }
    }
    local_98 = (char *)0x1;
  }
  else {
    pEVar14 = Element::operator[](s,1);
    local_88 = (string_view)Element::str(pEVar14);
    local_98 = (char *)0x2;
    local_90 = (char *)0x1;
  }
LAB_00997c59:
  local_c8 = local_88._M_str;
  local_48._16_8_ = s;
  if (local_88._M_str != (char *)0x0) goto LAB_00997c71;
  if (bVar12) {
    uVar27 = local_70->functionCounter;
    local_70->functionCounter = uVar27 + 1;
    uVar6 = -uVar27;
    if (0 < (int)uVar27) {
      uVar6 = uVar27;
    }
    uVar29 = 1;
    if (9 < uVar6) {
      uVar22 = (ulong)uVar6;
      uVar11 = 4;
      do {
        uVar29 = uVar11;
        uVar21 = (uint)uVar22;
        if (uVar21 < 100) {
          uVar29 = uVar29 - 2;
          goto LAB_00998595;
        }
        if (uVar21 < 1000) {
          uVar29 = uVar29 - 1;
          goto LAB_00998595;
        }
        if (uVar21 < 10000) goto LAB_00998595;
        uVar22 = uVar22 / 10000;
        uVar11 = uVar29 + 4;
      } while (99999 < uVar21);
      uVar29 = uVar29 + 1;
    }
LAB_00998595:
    local_c0[0] = local_b0;
    std::__cxx11::string::_M_construct((ulong)local_c0,(char)uVar29 - (char)((int)uVar27 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_c0[0] + (ulong)(uVar27 >> 0x1f)),uVar29,uVar6);
    plVar19 = (long *)std::__cxx11::string::replace((ulong)local_c0,0,(char *)0x0,0xbb8ff6);
    pSVar9 = local_70;
    pFVar17 = (Function *)(plVar19 + 2);
    if ((Function *)*plVar19 == pFVar17) {
      local_48._0_8_ = (pFVar17->super_Importable).super_Named.name.super_IString.str._M_len;
      local_48._8_8_ = plVar19[3];
      local_58._M_head_impl = (Function *)local_48;
    }
    else {
      local_48._0_8_ = (pFVar17->super_Importable).super_Named.name.super_IString.str._M_len;
      local_58._M_head_impl = (Function *)*plVar19;
    }
    func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         *(__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> *)
          &((__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> *)(plVar19 + 1))
           ->_M_t;
    *plVar19 = (long)pFVar17;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    s_01._M_str = (char *)0x0;
    s_01._M_len = (size_t)local_58._M_head_impl;
    local_88 = IString::interned((IString *)
                                 func._M_t.
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,s_01,
                                 SUB81(pFVar17,0));
    if (local_58._M_head_impl != (Function *)local_48) {
      operator_delete(local_58._M_head_impl,local_48._0_8_ + 1);
    }
    if (local_c0[0] != local_b0) {
      operator_delete(local_c0[0],local_b0[0] + 1);
    }
    iVar24._M_current =
         (pSVar9->functionNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (iVar24._M_current !=
        (pSVar9->functionNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      ((iVar24._M_current)->super_IString).str._M_len = local_88._M_len;
      ((iVar24._M_current)->super_IString).str._M_str = local_88._M_str;
      ppNVar2 = &(pSVar9->functionNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppNVar2 = *ppNVar2 + 1;
      goto LAB_00997c71;
    }
    this_00 = (vector<wasm::Name,std::allocator<wasm::Name>> *)&pSVar9->functionNames;
LAB_0099869c:
    std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
              (this_00,iVar24,(Name *)&local_88);
  }
  else {
    if (bVar7) goto LAB_00997c71;
    if (bVar8) {
      uVar27 = local_70->memoryCounter;
      local_70->memoryCounter = uVar27 + 1;
      uVar6 = -uVar27;
      if (0 < (int)uVar27) {
        uVar6 = uVar27;
      }
      uVar29 = 1;
      if (9 < uVar6) {
        uVar22 = (ulong)uVar6;
        uVar11 = 4;
        do {
          uVar29 = uVar11;
          uVar21 = (uint)uVar22;
          if (uVar21 < 100) {
            uVar29 = uVar29 - 2;
            goto LAB_0099873b;
          }
          if (uVar21 < 1000) {
            uVar29 = uVar29 - 1;
            goto LAB_0099873b;
          }
          if (uVar21 < 10000) goto LAB_0099873b;
          uVar22 = uVar22 / 10000;
          uVar11 = uVar29 + 4;
        } while (99999 < uVar21);
        uVar29 = uVar29 + 1;
      }
LAB_0099873b:
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct((ulong)local_c0,(char)uVar29 - (char)((int)uVar27 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_c0[0] + (ulong)(uVar27 >> 0x1f)),uVar29,uVar6);
      plVar19 = (long *)std::__cxx11::string::replace((ulong)local_c0,0,(char *)0x0,0xbb9072);
      local_58._M_head_impl = (Function *)local_48;
      pFVar17 = (Function *)(plVar19 + 2);
      if ((Function *)*plVar19 == pFVar17) {
        local_48._0_8_ = (pFVar17->super_Importable).super_Named.name.super_IString.str._M_len;
        local_48._8_8_ = plVar19[3];
      }
      else {
        local_48._0_8_ = (pFVar17->super_Importable).super_Named.name.super_IString.str._M_len;
        local_58._M_head_impl = (Function *)*plVar19;
      }
      func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           *(__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> *)
            &((__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> *)(plVar19 + 1)
             )->_M_t;
      *plVar19 = (long)pFVar17;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      s_02._M_str = (char *)0x0;
      s_02._M_len = (size_t)local_58._M_head_impl;
      local_88 = IString::interned((IString *)
                                   func._M_t.
                                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                   .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,s_02
                                   ,SUB81(pFVar17,0));
    }
    else {
      if ((char)local_5c == '\0') {
        if (!bVar30) {
          psVar20 = (string *)__cxa_allocate_exception(0x30);
          local_168 = local_158;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"invalid import","");
          pEVar14 = Element::operator[]((Element *)local_48._16_8_,3);
          sVar15 = pEVar14->line;
          pEVar14 = Element::operator[]((Element *)local_48._16_8_,3);
          sVar5 = pEVar14->col;
          *(string **)psVar20 = psVar20 + 0x10;
          std::__cxx11::string::_M_construct<char*>(psVar20,local_168,local_168 + local_160);
          *(size_t *)(psVar20 + 0x20) = sVar15;
          *(size_t *)(psVar20 + 0x28) = sVar5;
          __cxa_throw(psVar20,&ParseException::typeinfo,ParseException::~ParseException);
        }
        uVar27 = local_70->tagCounter;
        local_70->tagCounter = uVar27 + 1;
        uVar6 = -uVar27;
        if (0 < (int)uVar27) {
          uVar6 = uVar27;
        }
        uVar29 = 1;
        if (9 < uVar6) {
          uVar22 = (ulong)uVar6;
          uVar11 = 4;
          do {
            uVar29 = uVar11;
            uVar21 = (uint)uVar22;
            if (uVar21 < 100) {
              uVar29 = uVar29 - 2;
              goto LAB_009988e3;
            }
            if (uVar21 < 1000) {
              uVar29 = uVar29 - 1;
              goto LAB_009988e3;
            }
            if (uVar21 < 10000) goto LAB_009988e3;
            uVar22 = uVar22 / 10000;
            uVar11 = uVar29 + 4;
          } while (99999 < uVar21);
          uVar29 = uVar29 + 1;
        }
LAB_009988e3:
        local_c0[0] = local_b0;
        std::__cxx11::string::_M_construct
                  ((ulong)local_c0,(char)uVar29 - (char)((int)uVar27 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((long)local_c0[0] + (ulong)(uVar27 >> 0x1f)),uVar29,uVar6);
        plVar19 = (long *)std::__cxx11::string::replace((ulong)local_c0,0,(char *)0x0,0xbb9084);
        pSVar9 = local_70;
        pFVar17 = (Function *)(plVar19 + 2);
        if ((Function *)*plVar19 == pFVar17) {
          local_48._0_8_ = (pFVar17->super_Importable).super_Named.name.super_IString.str._M_len;
          local_48._8_8_ = plVar19[3];
          local_58._M_head_impl = (Function *)local_48;
        }
        else {
          local_48._0_8_ = (pFVar17->super_Importable).super_Named.name.super_IString.str._M_len;
          local_58._M_head_impl = (Function *)*plVar19;
        }
        func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
             *(__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> *)
              &((__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> *)
               (plVar19 + 1))->_M_t;
        *plVar19 = (long)pFVar17;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        sVar32._M_str = (char *)0x0;
        sVar32._M_len = (size_t)local_58._M_head_impl;
        local_88 = IString::interned((IString *)
                                     func._M_t.
                                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                     .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                                     sVar32,SUB81(pFVar17,0));
        if (local_58._M_head_impl != (Function *)local_48) {
          operator_delete(local_58._M_head_impl,local_48._0_8_ + 1);
        }
        if (local_c0[0] != local_b0) {
          operator_delete(local_c0[0],local_b0[0] + 1);
        }
        iVar24._M_current =
             (pSVar9->tagNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar24._M_current !=
            (pSVar9->tagNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ((iVar24._M_current)->super_IString).str._M_len = local_88._M_len;
          ((iVar24._M_current)->super_IString).str._M_str = local_88._M_str;
          ppNVar2 = &(pSVar9->tagNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppNVar2 = *ppNVar2 + 1;
          goto LAB_00997c71;
        }
        this_00 = (vector<wasm::Name,std::allocator<wasm::Name>> *)&pSVar9->tagNames;
        goto LAB_0099869c;
      }
      uVar27 = local_70->tableCounter;
      local_70->tableCounter = uVar27 + 1;
      uVar6 = -uVar27;
      if (0 < (int)uVar27) {
        uVar6 = uVar27;
      }
      uVar29 = 1;
      if (9 < uVar6) {
        uVar22 = (ulong)uVar6;
        uVar11 = 4;
        do {
          uVar29 = uVar11;
          uVar21 = (uint)uVar22;
          if (uVar21 < 100) {
            uVar29 = uVar29 - 2;
            goto LAB_009987fa;
          }
          if (uVar21 < 1000) {
            uVar29 = uVar29 - 1;
            goto LAB_009987fa;
          }
          if (uVar21 < 10000) goto LAB_009987fa;
          uVar22 = uVar22 / 10000;
          uVar11 = uVar29 + 4;
        } while (99999 < uVar21);
        uVar29 = uVar29 + 1;
      }
LAB_009987fa:
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct((ulong)local_c0,(char)uVar29 - (char)((int)uVar27 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_c0[0] + (ulong)(uVar27 >> 0x1f)),uVar29,uVar6);
      plVar19 = (long *)std::__cxx11::string::replace((ulong)local_c0,0,(char *)0x0,0xbb9037);
      local_58._M_head_impl = (Function *)local_48;
      pFVar17 = (Function *)(plVar19 + 2);
      if ((Function *)*plVar19 == pFVar17) {
        local_48._0_8_ = (pFVar17->super_Importable).super_Named.name.super_IString.str._M_len;
        local_48._8_8_ = plVar19[3];
      }
      else {
        local_48._0_8_ = (pFVar17->super_Importable).super_Named.name.super_IString.str._M_len;
        local_58._M_head_impl = (Function *)*plVar19;
      }
      func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           *(__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> *)
            &((__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> *)(plVar19 + 1)
             )->_M_t;
      *plVar19 = (long)pFVar17;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      s_03._M_str = (char *)0x0;
      s_03._M_len = (size_t)local_58._M_head_impl;
      local_88 = IString::interned((IString *)
                                   func._M_t.
                                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                   .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,s_03
                                   ,SUB81(pFVar17,0));
    }
    if (local_58._M_head_impl != (Function *)local_48) {
      operator_delete(local_58._M_head_impl,local_48._0_8_ + 1);
    }
    if (local_c0[0] != local_b0) {
      operator_delete(local_c0[0],local_b0[0] + 1);
    }
  }
LAB_00997c71:
  uVar26 = local_48._16_8_;
  uVar23 = 0;
  if ((char)local_a0 != '\0') {
    uVar23 = local_68._0_4_;
  }
  uVar27 = (uint)local_98;
  pEVar14 = Element::operator[]((Element *)local_48._16_8_,uVar27);
  IVar31 = Element::str(pEVar14);
  local_68 = IVar31.str._M_str;
  sVar15 = IVar31.str._M_len;
  uVar27 = uVar27 + 1;
  pEVar14 = Element::operator[]((Element *)uVar26,uVar27);
  if (pEVar14->isList_ == true) {
    psVar20 = (string *)__cxa_allocate_exception(0x30);
    local_148 = local_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"no name for import","");
    pEVar14 = Element::operator[]((Element *)local_48._16_8_,uVar27);
    sVar15 = pEVar14->line;
    pEVar14 = Element::operator[]((Element *)local_48._16_8_,uVar27);
    sVar5 = pEVar14->col;
    *(string **)psVar20 = psVar20 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar20,local_148,local_148 + local_140);
    *(size_t *)(psVar20 + 0x20) = sVar15;
    *(size_t *)(psVar20 + 0x28) = sVar5;
    __cxa_throw(psVar20,&ParseException::typeinfo,ParseException::~ParseException);
  }
  pEVar14 = Element::operator[]((Element *)uVar26,uVar27);
  sVar32 = (string_view)Element::str(pEVar14);
  if ((sVar15 == 0) || (sVar32._M_len == 0)) {
    psVar20 = (string *)__cxa_allocate_exception(0x30);
    local_128 = local_118;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"imports must have module and base","");
    pEVar14 = Element::operator[]((Element *)local_48._16_8_,uVar27);
    sVar15 = pEVar14->line;
    pEVar14 = Element::operator[]((Element *)local_48._16_8_,uVar27);
    sVar5 = pEVar14->col;
    *(string **)psVar20 = psVar20 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar20,local_128,local_128 + local_120);
    *(size_t *)(psVar20 + 0x20) = sVar15;
    *(size_t *)(psVar20 + 0x28) = sVar5;
    __cxa_throw(psVar20,&ParseException::typeinfo,ParseException::~ParseException);
  }
  if ((char)local_a0 == '\0') {
    pcVar28 = local_98 + 2;
  }
  else {
    local_48._16_8_ = Element::operator[]((Element *)local_48._16_8_,3);
    pcVar28 = local_90;
  }
  pSVar9 = local_70;
  uVar27 = (uint)pcVar28;
  switch(uVar23) {
  case 0:
    local_98 = sVar32._M_str;
    local_90 = pcVar28;
    pFVar17 = (Function *)operator_new(0x1f8);
    memset(pFVar17,0,0x1f8);
    local_a0 = &pFVar17->type;
    HeapType::HeapType(&pFVar17->type,(Signature)ZEXT816(0));
    pSVar9 = local_70;
    pFVar17->profile = Normal;
    (pFVar17->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pFVar17->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pFVar17->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pFVar17->body = (Expression *)0x0;
    (pFVar17->stackIR)._M_t.
    super___uniq_ptr_impl<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
    .
    super__Head_base<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_false>
    ._M_head_impl = (vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_> *)0x0;
    (pFVar17->localNames)._M_h._M_buckets = &(pFVar17->localNames)._M_h._M_single_bucket;
    (pFVar17->localNames)._M_h._M_bucket_count = 1;
    (pFVar17->localNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pFVar17->localNames)._M_h._M_element_count = 0;
    (pFVar17->localNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (pFVar17->localNames)._M_h._M_rehash_policy._M_next_resize = 0;
    (pFVar17->localNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (pFVar17->localIndices)._M_h._M_buckets = &(pFVar17->localIndices)._M_h._M_single_bucket;
    (pFVar17->localIndices)._M_h._M_bucket_count = 1;
    (pFVar17->localIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pFVar17->localIndices)._M_h._M_element_count = 0;
    (pFVar17->localIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (pFVar17->localIndices)._M_h._M_rehash_policy._M_next_resize = 0;
    (pFVar17->localIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (pFVar17->debugLocations)._M_h._M_buckets = &(pFVar17->debugLocations)._M_h._M_single_bucket;
    (pFVar17->debugLocations)._M_h._M_bucket_count = 1;
    (pFVar17->debugLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pFVar17->debugLocations)._M_h._M_element_count = 0;
    (pFVar17->debugLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (pFVar17->debugLocations)._M_h._M_rehash_policy._M_next_resize = 0;
    (pFVar17->debugLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    p_Var1 = &(pFVar17->prologLocation)._M_t._M_impl.super__Rb_tree_header;
    (pFVar17->prologLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (pFVar17->prologLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (pFVar17->prologLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (pFVar17->prologLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (pFVar17->prologLocation)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var1 = &(pFVar17->epilogLocation)._M_t._M_impl.super__Rb_tree_header;
    (pFVar17->epilogLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (pFVar17->epilogLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (pFVar17->epilogLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (pFVar17->epilogLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (pFVar17->epilogLocation)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (pFVar17->expressionLocations)._M_h._M_buckets =
         &(pFVar17->expressionLocations)._M_h._M_single_bucket;
    (pFVar17->expressionLocations)._M_h._M_bucket_count = 1;
    (pFVar17->expressionLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pFVar17->expressionLocations)._M_h._M_element_count = 0;
    (pFVar17->expressionLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (pFVar17->expressionLocations)._M_h._M_rehash_policy._M_next_resize = 0;
    (pFVar17->expressionLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (pFVar17->delimiterLocations)._M_h._M_buckets =
         &(pFVar17->delimiterLocations)._M_h._M_single_bucket;
    (pFVar17->delimiterLocations)._M_h._M_bucket_count = 1;
    (pFVar17->delimiterLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pFVar17->delimiterLocations)._M_h._M_element_count = 0;
    (pFVar17->delimiterLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    *(undefined8 *)((long)&(pFVar17->delimiterLocations)._M_h._M_single_bucket + 4) = 0;
    (pFVar17->funcLocation).declarations = 0;
    (pFVar17->funcLocation).end = 0;
    (pFVar17->delimiterLocations)._M_h._M_rehash_policy._M_next_resize = 0;
    (pFVar17->delimiterLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_58._M_head_impl = pFVar17;
    local_90 = (char *)parseTypeUse(local_70,(Element *)local_48._16_8_,(size_t)local_90,local_a0);
    _Var10._M_head_impl = local_58._M_head_impl;
    ((local_58._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len =
         local_88._M_len;
    ((local_58._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
         local_88._M_str;
    ((local_58._M_head_impl)->super_Importable).super_Named.hasExplicitName =
         local_c8 != (char *)0x0;
    ((local_58._M_head_impl)->super_Importable).module.super_IString.str._M_len = sVar15;
    ((local_58._M_head_impl)->super_Importable).module.super_IString.str._M_str = local_68;
    ((local_58._M_head_impl)->super_Importable).base.super_IString.str._M_len = sVar32._M_len;
    ((local_58._M_head_impl)->super_Importable).base.super_IString.str._M_str = local_98;
    pmVar16 = std::
              map<wasm::Name,_wasm::HeapType,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::HeapType>_>_>
              ::operator[](&pSVar9->functionTypes,(key_type *)&local_88);
    curr._M_head_impl = local_58._M_head_impl;
    pmVar16->id = ((_Var10._M_head_impl)->type).id;
    local_58._M_head_impl = (Function *)0x0;
    Module::addFunction(pSVar9->wasm,curr._M_head_impl);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
              ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_58);
    pcVar28 = local_90;
    break;
  case 1:
    local_90 = pcVar28;
    pFVar17 = (Function *)operator_new(0x50);
    *(undefined8 *)&pFVar17->profile = 0;
    (pFVar17->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pFVar17->super_Importable).super_Named.name.super_IString.str._M_len = 0;
    (pFVar17->super_Importable).super_Named.name.super_IString.str._M_str = (char *)0x0;
    *(undefined8 *)&(pFVar17->super_Importable).super_Named.hasExplicitName = 0;
    (pFVar17->super_Importable).module.super_IString.str._M_len = 0;
    (pFVar17->super_Importable).module.super_IString.str._M_str = (char *)0x0;
    (pFVar17->super_Importable).base.super_IString.str._M_len = 0;
    (pFVar17->super_Importable).base.super_IString.str._M_str = (char *)0x0;
    (pFVar17->type).id = 0;
    *(undefined8 *)&pFVar17->profile = 0xffffffff;
    wasm::Type::Type((Type *)&pFVar17->vars,(HeapType)0x1,Nullable);
    pSVar9 = local_70;
    (pFVar17->super_Importable).super_Named.name.super_IString.str._M_len = local_88._M_len;
    (pFVar17->super_Importable).super_Named.name.super_IString.str._M_str = local_88._M_str;
    (pFVar17->super_Importable).super_Named.hasExplicitName = local_c8 != (char *)0x0;
    (pFVar17->super_Importable).module.super_IString.str._M_len = sVar15;
    (pFVar17->super_Importable).module.super_IString.str._M_str = local_68;
    (pFVar17->super_Importable).base.super_IString.str = sVar32;
    iVar24._M_current =
         (local_70->tableNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_58._M_head_impl = pFVar17;
    if (iVar24._M_current ==
        (local_70->tableNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                ((vector<wasm::Name,std::allocator<wasm::Name>> *)&local_70->tableNames,iVar24,
                 (Name *)&local_88);
    }
    else {
      ((iVar24._M_current)->super_IString).str._M_len = local_88._M_len;
      ((iVar24._M_current)->super_IString).str._M_str = local_88._M_str;
      ppNVar2 = &(local_70->tableNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppNVar2 = *ppNVar2 + 1;
    }
    uVar26 = local_48._16_8_;
    pcVar28 = local_90;
    pLVar13 = Element::list((Element *)local_48._16_8_);
    if (pcVar28 < (char *)((pLVar13->
                           super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).
                           usedElements - 1)) {
      pEVar14 = Element::operator[]((Element *)uVar26,(uint)pcVar28);
      AVar18 = getAddress(pEVar14);
      ((local_58._M_head_impl)->type).id = AVar18.addr;
      checkAddress(AVar18,"excessive table init size",pEVar14);
      pcVar28 = (char *)(ulong)((uint)pcVar28 + 1);
    }
    pLVar13 = Element::list((Element *)uVar26);
    uVar27 = (uint)pcVar28;
    if (((ulong)pcVar28 & 0xffffffff) <
        (pLVar13->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).usedElements
        - 1) {
      pEVar14 = Element::operator[]((Element *)uVar26,uVar27);
      AVar18 = getAddress(pEVar14);
      *(address64_t *)&(local_58._M_head_impl)->profile = AVar18.addr;
      checkAddress(AVar18,"excessive table max size",pEVar14);
      uVar27 = uVar27 + 1;
    }
    else {
      *(undefined8 *)&(local_58._M_head_impl)->profile = 0xffffffff;
    }
    Module::addTable(pSVar9->wasm,
                     (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)&local_58);
    if (local_58._M_head_impl != (Function *)0x0) {
      operator_delete(local_58._M_head_impl,0x50);
    }
    pcVar28 = (char *)(ulong)(uVar27 + 1);
    break;
  case 2:
    local_58._M_head_impl = (Function *)operator_new(0x58);
    pSVar9 = local_70;
    *(undefined8 *)&(local_58._M_head_impl)->profile = 0;
    ((local_58._M_head_impl)->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_58._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len = 0;
    ((local_58._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
         (char *)0x0;
    *(undefined8 *)&((local_58._M_head_impl)->super_Importable).super_Named.hasExplicitName = 0;
    ((local_58._M_head_impl)->super_Importable).module.super_IString.str._M_len = 0;
    ((local_58._M_head_impl)->super_Importable).module.super_IString.str._M_str = (char *)0x0;
    ((local_58._M_head_impl)->super_Importable).base.super_IString.str._M_len = 0;
    ((local_58._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
    ((local_58._M_head_impl)->type).id = 0;
    *(undefined8 *)&(local_58._M_head_impl)->profile = 0x10000;
    *(undefined1 *)
     &((local_58._M_head_impl)->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
      _M_impl.super__Vector_impl_data._M_start = 0;
    ((local_58._M_head_impl)->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
    ((local_58._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len =
         local_88._M_len;
    ((local_58._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
         local_88._M_str;
    ((local_58._M_head_impl)->super_Importable).super_Named.hasExplicitName =
         local_c8 != (char *)0x0;
    ((local_58._M_head_impl)->super_Importable).module.super_IString.str._M_len = sVar15;
    ((local_58._M_head_impl)->super_Importable).module.super_IString.str._M_str = local_68;
    ((local_58._M_head_impl)->super_Importable).base.super_IString.str = sVar32;
    iVar24._M_current =
         (local_70->memoryNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (iVar24._M_current ==
        (local_70->memoryNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                ((vector<wasm::Name,std::allocator<wasm::Name>> *)&local_70->memoryNames,iVar24,
                 (Name *)&local_88);
    }
    else {
      ((iVar24._M_current)->super_IString).str._M_len = local_88._M_len;
      ((iVar24._M_current)->super_IString).str._M_str = local_88._M_str;
      ppNVar2 = &(local_70->memoryNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppNVar2 = *ppNVar2 + 1;
    }
    uVar26 = local_48._16_8_;
    pSVar25 = (SExpressionWasmBuilder *)local_48._16_8_;
    pEVar14 = Element::operator[]((Element *)local_48._16_8_,uVar27);
    if (pEVar14->isList_ == true) {
      s_00 = (SExpressionWasmBuilder *)Element::operator[]((Element *)uVar26,uVar27);
      str_02.str._M_str = extraout_RDX_03;
      str_02.str._M_len = DAT_00dbd360;
      pSVar25 = s_00;
      bVar12 = elementStartsWith((Element *)s_00,str_02);
      if (!bVar12) {
        psVar20 = (string *)__cxa_allocate_exception(0x30);
        local_108 = local_f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,"bad memory limit declaration","");
        pEVar14 = Element::operator[]((Element *)local_48._16_8_,uVar27);
        sVar15 = pEVar14->line;
        pEVar14 = Element::operator[]((Element *)local_48._16_8_,uVar27);
        sVar5 = pEVar14->col;
        *(string **)psVar20 = psVar20 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar20,local_108,local_108 + local_100);
        *(size_t *)(psVar20 + 0x20) = sVar15;
        *(size_t *)(psVar20 + 0x28) = sVar5;
        __cxa_throw(psVar20,&ParseException::typeinfo,ParseException::~ParseException);
      }
      *(undefined1 *)
       &((local_58._M_head_impl)->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
        _M_impl.super__Vector_impl_data._M_start = 1;
      uVar27 = parseMemoryLimits(pSVar25,(Element *)s_00,1,
                                 (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                                 &local_58);
    }
    else {
      uVar27 = parseMemoryLimits(pSVar25,(Element *)uVar26,uVar27,
                                 (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                                 &local_58);
    }
    Module::addMemory(pSVar9->wasm,
                      (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)&local_58);
    pcVar28 = (char *)(ulong)uVar27;
    if (local_58._M_head_impl != (Function *)0x0) {
      operator_delete(local_58._M_head_impl,0x58);
    }
    break;
  case 3:
    parseGlobal(local_70,(Element *)local_48._16_8_,true);
    puVar3 = (pSVar9->wasm->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    _Var4._M_head_impl =
         puVar3[-1]._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
         super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    *(size_t *)&((Name *)((long)&(_Var4._M_head_impl)->super_Importable + 0x18))->super_IString =
         sVar15;
    *(char **)((long)&(_Var4._M_head_impl)->super_Importable + 0x20) = local_68;
    *(string_view *)
     ((long)&(puVar3[-1]._M_t.
              super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
              super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->super_Importable + 0x28) =
         sVar32;
    pcVar28 = (char *)(ulong)(uVar27 + 1);
    break;
  case 4:
    curr_00 = (Tag *)operator_new(0x48);
    (curr_00->super_Importable).super_Named.name.super_IString.str._M_len = 0;
    (curr_00->super_Importable).super_Named.name.super_IString.str._M_str = (char *)0x0;
    *(undefined8 *)&(curr_00->super_Importable).super_Named.hasExplicitName = 0;
    (curr_00->super_Importable).module.super_IString.str._M_len = 0;
    (curr_00->super_Importable).module.super_IString.str._M_str = (char *)0x0;
    (curr_00->super_Importable).base.super_IString.str._M_len = 0;
    (curr_00->super_Importable).base.super_IString.str._M_str = (char *)0x0;
    (curr_00->sig).params.id = 0;
    (curr_00->sig).results.id = 0;
    local_58._M_head_impl = (Function *)0x1;
    pcVar28 = (char *)parseTypeUse(local_70,(Element *)local_48._16_8_,(size_t)pcVar28,
                                   (HeapType *)&local_58);
    SVar33 = HeapType::getSignature((HeapType *)&local_58);
    curr_00->sig = SVar33;
    (curr_00->super_Importable).super_Named.name.super_IString.str._M_len = local_88._M_len;
    (curr_00->super_Importable).super_Named.name.super_IString.str._M_str = local_88._M_str;
    (curr_00->super_Importable).super_Named.hasExplicitName = local_c8 != (char *)0x0;
    (curr_00->super_Importable).module.super_IString.str._M_len = sVar15;
    (curr_00->super_Importable).module.super_IString.str._M_str = local_68;
    (curr_00->super_Importable).base.super_IString.str = sVar32;
    Module::addTag(local_70->wasm,curr_00);
  }
  pLVar13 = Element::list((Element *)local_48._16_8_);
  if (((ulong)pcVar28 & 0xffffffff) <
      (pLVar13->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).usedElements)
  {
    psVar20 = (string *)__cxa_allocate_exception(0x30);
    local_e8 = local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"invalid element","");
    pEVar14 = Element::operator[]((Element *)local_48._16_8_,(uint)pcVar28);
    sVar15 = pEVar14->line;
    pEVar14 = Element::operator[]((Element *)local_48._16_8_,(uint)pcVar28);
    sVar5 = pEVar14->col;
    *(string **)psVar20 = psVar20 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar20,local_e8,local_e8 + local_e0);
    *(size_t *)(psVar20 + 0x20) = sVar15;
    *(size_t *)(psVar20 + 0x28) = sVar5;
    __cxa_throw(psVar20,&ParseException::typeinfo,ParseException::~ParseException);
  }
  return;
}

Assistant:

void SExpressionWasmBuilder::parseImport(Element& s) {
  size_t i = 1;
  // (import "env" "STACKTOP" (global $stackTop i32))
  bool newStyle = s.size() == 4 && s[3]->isList();
  auto kind = ExternalKind::Invalid;
  if (newStyle) {
    if (elementStartsWith(*s[3], FUNC)) {
      kind = ExternalKind::Function;
    } else if (elementStartsWith(*s[3], MEMORY)) {
      kind = ExternalKind::Memory;
    } else if (elementStartsWith(*s[3], TABLE)) {
      kind = ExternalKind::Table;
    } else if (elementStartsWith(*s[3], GLOBAL)) {
      kind = ExternalKind::Global;
    } else if ((*s[3])[0]->str() == TAG) {
      kind = ExternalKind::Tag;
    } else {
      newStyle = false; // either (param..) or (result..)
    }
  }
  Index newStyleInner = 1;
  Name name;
  if (s.size() > 3 && s[3]->isStr()) {
    name = s[i++]->str();
  } else if (newStyle && newStyleInner < s[3]->size() &&
             (*s[3])[newStyleInner]->dollared()) {
    name = (*s[3])[newStyleInner++]->str();
  }
  bool hasExplicitName = name.is();
  if (!hasExplicitName) {
    if (kind == ExternalKind::Function) {
      name = Name("fimport$" + std::to_string(functionCounter++));
      functionNames.push_back(name);
    } else if (kind == ExternalKind::Global) {
      // Handled in `parseGlobal`.
    } else if (kind == ExternalKind::Memory) {
      name = Name("mimport$" + std::to_string(memoryCounter++));
    } else if (kind == ExternalKind::Table) {
      name = Name("timport$" + std::to_string(tableCounter++));
    } else if (kind == ExternalKind::Tag) {
      name = Name("eimport$" + std::to_string(tagCounter++));
      tagNames.push_back(name);
    } else {
      throw ParseException("invalid import", s[3]->line, s[3]->col);
    }
  }
  if (!newStyle) {
    kind = ExternalKind::Function;
  }
  auto module = s[i++]->str();
  if (!s[i]->isStr()) {
    throw ParseException("no name for import", s[i]->line, s[i]->col);
  }
  auto base = s[i]->str();
  if (!module.size() || !base.size()) {
    throw ParseException(
      "imports must have module and base", s[i]->line, s[i]->col);
  }
  i++;
  // parse internals
  Element& inner = newStyle ? *s[3] : s;
  Index j = newStyle ? newStyleInner : i;
  if (kind == ExternalKind::Function) {
    auto func = std::make_unique<Function>();

    j = parseTypeUse(inner, j, func->type);
    func->setName(name, hasExplicitName);
    func->module = module;
    func->base = base;
    functionTypes[name] = func->type;
    wasm.addFunction(func.release());
  } else if (kind == ExternalKind::Global) {
    parseGlobal(inner, true);
    j++;
    auto& global = wasm.globals.back();
    global->module = module;
    global->base = base;
  } else if (kind == ExternalKind::Table) {
    auto table = std::make_unique<Table>();
    table->setName(name, hasExplicitName);
    table->module = module;
    table->base = base;
    tableNames.push_back(name);

    if (j < inner.size() - 1) {
      auto initElem = inner[j++];
      table->initial = getAddress(initElem);
      checkAddress(table->initial, "excessive table init size", initElem);
    }
    if (j < inner.size() - 1) {
      auto maxElem = inner[j++];
      table->max = getAddress(maxElem);
      checkAddress(table->max, "excessive table max size", maxElem);
    } else {
      table->max = Table::kUnlimitedSize;
    }

    wasm.addTable(std::move(table));

    j++; // funcref
    // ends with the table element type
  } else if (kind == ExternalKind::Memory) {
    auto memory = std::make_unique<Memory>();
    memory->setName(name, hasExplicitName);
    memory->module = module;
    memory->base = base;
    memoryNames.push_back(name);

    if (inner[j]->isList()) {
      auto& limits = *inner[j];
      if (!elementStartsWith(limits, SHARED)) {
        throw ParseException(
          "bad memory limit declaration", inner[j]->line, inner[j]->col);
      }
      memory->shared = true;
      j = parseMemoryLimits(limits, 1, memory);
    } else {
      j = parseMemoryLimits(inner, j, memory);
    }

    wasm.addMemory(std::move(memory));
  } else if (kind == ExternalKind::Tag) {
    auto tag = std::make_unique<Tag>();
    HeapType tagType;
    j = parseTypeUse(inner, j, tagType);
    tag->sig = tagType.getSignature();
    tag->setName(name, hasExplicitName);
    tag->module = module;
    tag->base = base;
    wasm.addTag(tag.release());
  }
  // If there are more elements, they are invalid
  if (j < inner.size()) {
    throw ParseException("invalid element", inner[j]->line, inner[j]->col);
  }
}